

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu_snapshot.cpp
# Opt level: O1

void __thiscall Nes_Apu::save_snapshot(Nes_Apu *this,apu_snapshot_t *state)

{
  int i;
  ulong uVar1;
  
  uVar1 = 0;
  do {
    state->w40xx[uVar1] = this->oscs[uVar1 >> 2 & 0x3fffffff]->regs[(uint)uVar1 & 3];
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x14);
  state->w40xx[0x11] = (byte)(this->dmc).dac;
  state->w4015 = (byte)this->osc_enables;
  state->w4017 = (byte)this->frame_mode;
  state->delay = (uint16_t)this->frame_delay;
  state->step = (byte)this->frame;
  state->irq_flag = this->irq_flag;
  (state->square1).env[0] = (byte)(this->square1).super_Nes_Envelope.env_delay;
  (state->square1).env[1] = (byte)(this->square1).super_Nes_Envelope.envelope;
  (state->square1).env[2] = (this->square1).super_Nes_Envelope.super_Nes_Osc.reg_written[3];
  (state->square1).delay = (uint16_t)(this->square1).super_Nes_Envelope.super_Nes_Osc.delay;
  (state->square1).length = (byte)(this->square1).super_Nes_Envelope.super_Nes_Osc.length_counter;
  (state->square1).phase = (byte)(this->square1).phase;
  (state->square1).swp_delay = (byte)(this->square1).sweep_delay;
  (state->square1).swp_reset = (this->square1).super_Nes_Envelope.super_Nes_Osc.reg_written[1];
  (state->square2).env[0] = (byte)(this->square2).super_Nes_Envelope.env_delay;
  (state->square2).env[1] = (byte)(this->square2).super_Nes_Envelope.envelope;
  (state->square2).env[2] = (this->square2).super_Nes_Envelope.super_Nes_Osc.reg_written[3];
  (state->square2).delay = (uint16_t)(this->square2).super_Nes_Envelope.super_Nes_Osc.delay;
  (state->square2).length = (byte)(this->square2).super_Nes_Envelope.super_Nes_Osc.length_counter;
  (state->square2).phase = (byte)(this->square2).phase;
  (state->square2).swp_delay = (byte)(this->square2).sweep_delay;
  (state->square2).swp_reset = (this->square2).super_Nes_Envelope.super_Nes_Osc.reg_written[1];
  (state->triangle).delay = (uint16_t)(this->triangle).super_Nes_Osc.delay;
  (state->triangle).length = (byte)(this->triangle).super_Nes_Osc.length_counter;
  (state->triangle).linear_counter = (byte)(this->triangle).linear_counter;
  (state->triangle).linear_mode = (this->triangle).super_Nes_Osc.reg_written[3];
  (state->noise).env[0] = (byte)(this->noise).super_Nes_Envelope.env_delay;
  (state->noise).env[1] = (byte)(this->noise).super_Nes_Envelope.envelope;
  (state->noise).env[2] = (this->noise).super_Nes_Envelope.super_Nes_Osc.reg_written[3];
  (state->noise).delay = (uint16_t)(this->noise).super_Nes_Envelope.super_Nes_Osc.delay;
  (state->noise).length = (byte)(this->noise).super_Nes_Envelope.super_Nes_Osc.length_counter;
  (state->noise).shift_reg = (uint16_t)(this->noise).noise;
  (state->dmc).delay = (uint16_t)(this->dmc).super_Nes_Osc.delay;
  (state->dmc).remain = (uint16_t)(this->dmc).super_Nes_Osc.length_counter;
  (state->dmc).buf = (byte)(this->dmc).buf;
  (state->dmc).bits_remain = (byte)(this->dmc).bits_remain;
  (state->dmc).bits = (byte)(this->dmc).bits;
  (state->dmc).buf_empty = (this->dmc).buf_empty;
  (state->dmc).silence = (this->dmc).silence;
  (state->dmc).irq_flag = (this->dmc).irq_flag;
  (state->dmc).addr = (ushort)(this->dmc).address | 0x8000;
  return;
}

Assistant:

void Nes_Apu::save_snapshot( apu_snapshot_t* state ) const
{
	for ( int i = 0; i < osc_count * 4; i++ )
		state->w40xx [i] = oscs [i >> 2]->regs [i & 3];
	state->w40xx [0x11] = dmc.dac;
	
	state->w4015    = osc_enables;
	state->w4017    = frame_mode;
	state->delay    = frame_delay;
	state->step     = frame;
	state->irq_flag = irq_flag;
	
	typedef apu_reflection<1> refl;
	Nes_Apu& apu = *(Nes_Apu*) this; // const_cast
	refl::reflect_square  ( state->square1,     apu.square1 );
	refl::reflect_square  ( state->square2,     apu.square2 );
	refl::reflect_triangle( state->triangle,    apu.triangle );
	refl::reflect_noise   ( state->noise,       apu.noise );
	refl::reflect_dmc     ( state->dmc,         apu.dmc );
}